

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void mean_double_suite::test_linear_decrease(void)

{
  undefined8 local_b8;
  value_type local_b0 [2];
  undefined8 local_a0;
  value_type local_98 [2];
  undefined8 local_88;
  value_type local_80 [2];
  undefined8 local_70;
  value_type local_68 [2];
  undefined8 local_58;
  value_type local_50 [2];
  undefined8 local_40;
  value_type local_38 [2];
  undefined1 local_28 [8];
  moment<double,_4> filter;
  
  trial::online::interim::basic_moment<double,_4UL,_(trial::online::with)1>::basic_moment
            ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_28);
  trial::online::interim::detail::
  basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1> *)local_28,
             10.0);
  local_38[0] = trial::online::interim::detail::
                basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>::mean
                          ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>
                            *)local_28);
  local_40 = 0x4024000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","10.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0xc6,"void mean_double_suite::test_linear_decrease()",local_38,&local_40);
  trial::online::interim::detail::
  basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1> *)local_28,
             9.0);
  local_50[0] = trial::online::interim::detail::
                basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>::mean
                          ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>
                            *)local_28);
  local_58 = 0x4023000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","9.5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,200,"void mean_double_suite::test_linear_decrease()",local_50,&local_58);
  trial::online::interim::detail::
  basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1> *)local_28,
             8.0);
  local_68[0] = trial::online::interim::detail::
                basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>::mean
                          ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>
                            *)local_28);
  local_70 = 0x4022000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","9.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0xca,"void mean_double_suite::test_linear_decrease()",local_68,&local_70);
  trial::online::interim::detail::
  basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1> *)local_28,
             7.0);
  local_80[0] = trial::online::interim::detail::
                basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>::mean
                          ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>
                            *)local_28);
  local_88 = 0x4021000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","8.5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0xcc,"void mean_double_suite::test_linear_decrease()",local_80,&local_88);
  trial::online::interim::detail::
  basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1> *)local_28,
             6.0);
  local_98[0] = trial::online::interim::detail::
                basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>::mean
                          ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>
                            *)local_28);
  local_a0 = 0x401e000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","7.5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0xce,"void mean_double_suite::test_linear_decrease()",local_98,&local_a0);
  trial::online::interim::detail::
  basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1> *)local_28,
             5.0);
  local_b0[0] = trial::online::interim::detail::
                basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>::mean
                          ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>
                            *)local_28);
  local_b8 = 0x401a000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","6.5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0xd0,"void mean_double_suite::test_linear_decrease()",local_b0,&local_b8);
  return;
}

Assistant:

void test_linear_decrease()
{
    interim::moment<double, 4> filter;
    filter.push(10.0);
    TRIAL_TEST_EQ(filter.mean(), 10.0);
    filter.push(9.0);
    TRIAL_TEST_EQ(filter.mean(), 9.5);
    filter.push(8.0);
    TRIAL_TEST_EQ(filter.mean(), 9.0);
    filter.push(7.0);
    TRIAL_TEST_EQ(filter.mean(), 8.5);
    filter.push(6.0);
    TRIAL_TEST_EQ(filter.mean(), 7.5);
    filter.push(5.0);
    TRIAL_TEST_EQ(filter.mean(), 6.5);
}